

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

string * __thiscall
sznet::net::Buffer::retrieveAsString_abi_cxx11_
          (string *__return_storage_ptr__,Buffer *this,size_t len)

{
  pointer pcVar1;
  
  if (len <= this->m_writerIndex - this->m_readerIndex) {
    pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + this->m_readerIndex;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + len);
    retrieve(this,len);
    return __return_storage_ptr__;
  }
  __assert_fail("len <= readableBytes()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0xa5,"string sznet::net::Buffer::retrieveAsString(size_t)");
}

Assistant:

string retrieveAsString(size_t len)
	{
		assert(len <= readableBytes());
		string result(peek(), len);
		retrieve(len);
		return result;
	}